

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_target.cc
# Opt level: O2

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  StringPieceInputFileFactory factory;
  allocator<char> local_41;
  string local_40;
  InputFileFactory local_20;
  size_t local_18;
  uint8_t *local_10;
  
  local_20._vptr_InputFileFactory = (_func_int **)&PTR__InputFileFactory_005bb050;
  local_18 = size;
  local_10 = data;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"segments",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"sections",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"symbols",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"compileunits",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"inlines",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"armembers",&local_41);
  bloaty::RunBloaty(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int LLVMFuzzerTestOneInput(const uint8_t *data, size_t size) {
  const char *data2 = reinterpret_cast<const char*>(data);
  bloaty::StringPieceInputFileFactory factory(string_view(data2, size));

  // Try all of the data sources.
  RunBloaty(factory, "segments");
  RunBloaty(factory, "sections");
  RunBloaty(factory, "symbols");
  RunBloaty(factory, "compileunits");
  RunBloaty(factory, "inlines");
  RunBloaty(factory, "armembers");

  return 0;
}